

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O2

char * nng_str_sockaddr(nng_sockaddr *sa,char *buf,size_t bufsz)

{
  ushort uVar1;
  uint32_t uVar2;
  uint8_t i;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  uint8_t i_1;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  char *pcVar13;
  char local_88 [48];
  ulong local_58;
  ulong local_50;
  char *local_48;
  size_t local_40;
  uint32_t local_34;
  
  switch(sa->s_family) {
  case 1:
    pcVar13 = (sa->s_ipc).sa_path;
    pcVar7 = "inproc[%s]";
    break;
  case 2:
    pcVar13 = (sa->s_ipc).sa_path;
    pcVar7 = "%s";
    break;
  case 3:
    snprintf(buf,bufsz,"%u.%u.%u.%u:%u",(ulong)(sa->s_in6).sa_addr[0],(ulong)(sa->s_in6).sa_addr[1],
             (ulong)(sa->s_in6).sa_addr[2],(ulong)(sa->s_in6).sa_addr[3],
             (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
    return buf;
  case 4:
    uVar2 = (sa->s_in6).sa_scope;
    iVar3 = bcmp((sa->s_ipc).sa_path + 2,&DAT_0013bfe8,0xc);
    local_48 = buf;
    local_40 = bufsz;
    local_34 = uVar2;
    if (iVar3 == 0) {
      snprintf(local_88,0x2e,"::ffff:%u.%u.%u.%u",(ulong)(sa->s_in6).sa_addr[0xc],
               (ulong)(sa->s_in6).sa_addr[0xd],(ulong)(sa->s_in6).sa_addr[0xe],
               (ulong)(sa->s_in6).sa_addr[0xf]);
    }
    else {
      uVar4 = 0;
      uVar6 = 0;
      uVar10 = 0;
      uVar8 = 0;
      uVar9 = 0;
      while( true ) {
        local_50 = uVar9 & 0xff;
        local_58 = uVar8 & 0xff;
        if (0xf < uVar4) break;
        uVar11 = 0;
        if ((*(char *)((long)sa + uVar4 + 4) == '\0') && (*(char *)((long)sa + uVar4 + 5) == '\0'))
        {
          uVar11 = uVar10 + 2;
          uVar6 = uVar6 & 0xff;
          if ((uVar11 & 0xff) == 2) {
            uVar6 = uVar4 & 0xffffffff;
          }
          uVar8 = local_58;
          uVar9 = local_50;
          if ((uint)local_50 < (uVar11 & 0xff)) {
            uVar9 = (ulong)uVar11;
            uVar8 = uVar6;
          }
        }
        uVar10 = uVar11;
        uVar4 = uVar4 + 2;
      }
      if ((byte)uVar9 < 2) {
        local_58 = 0xff;
      }
      local_88[0] = '\0';
      local_50 = local_58 + local_50;
      bVar12 = false;
      iVar3 = 0;
      for (uVar8 = 0; uVar8 < 0x10; uVar8 = uVar8 + 2) {
        if (local_58 == uVar8) {
          if (0x2b < iVar3) {
            nni_panic("%s: %d: assert err: %s",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockaddr.c"
                      ,0x55,"idx <= 43");
          }
          pcVar7 = local_88 + iVar3;
          sVar5 = strlen(pcVar7);
          (pcVar7 + sVar5)[0] = ':';
          (pcVar7 + sVar5)[1] = ':';
          pcVar7[sVar5 + 2] = '\0';
          iVar3 = iVar3 + 2;
          bVar12 = false;
        }
        else if ((uVar8 < local_58) || (local_50 <= uVar8)) {
          if (0x28 < iVar3) {
            nni_panic("%s: %d: assert err: %s",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockaddr.c"
                      ,0x5c,"idx <= 40");
          }
          pcVar7 = "%x";
          if (bVar12) {
            pcVar7 = ":%x";
          }
          uVar1 = *(ushort *)((long)sa + uVar8 + 4);
          snprintf(local_88 + iVar3,6,pcVar7,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
          sVar5 = strlen(local_88 + iVar3);
          iVar3 = iVar3 + (int)sVar5;
          bVar12 = true;
        }
      }
    }
    pcVar7 = local_48;
    if (local_34 != 0) {
      snprintf(local_48,local_40,"[%s%%%u]:%u",local_88,(ulong)(sa->s_in6).sa_scope,
               (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
      return pcVar7;
    }
    snprintf(local_48,local_40,"[%s]:%u",local_88,
             (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
    return pcVar7;
  case 5:
    pcVar13 = (sa->s_ipc).sa_path + 2;
    pcVar7 = "abstract[%s]";
    break;
  default:
    return "unknown";
  }
  snprintf(buf,bufsz,pcVar7,pcVar13);
  return buf;
}

Assistant:

const char *
nng_str_sockaddr(const nng_sockaddr *sa, char *buf, size_t bufsz)
{
	switch (sa->s_family) {
	case NNG_AF_INPROC:
		return (str_sa_inproc(&sa->s_inproc, buf, bufsz));
	case NNG_AF_INET:
		return (str_sa_inet(&sa->s_in, buf, bufsz));
	case NNG_AF_INET6:
		return (str_sa_inet6(&sa->s_in6, buf, bufsz));
	case NNG_AF_IPC:
		return (str_sa_ipc(&sa->s_ipc, buf, bufsz));
	case NNG_AF_ABSTRACT:
		return (str_sa_abstract(&sa->s_abstract, buf, bufsz));
	case NNG_AF_UNSPEC:
	default:
		return ("unknown");
	}
}